

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

int Extra_Power3(int Num)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  
  if (0 < Num) {
    uVar9 = Num - 1;
    iVar5 = 4;
    uVar1 = 1;
    uVar3 = 1;
    uVar4 = 1;
    uVar2 = 1;
    do {
      uVar13 = uVar2;
      uVar12 = uVar4;
      uVar11 = uVar3;
      uVar10 = uVar1;
      uVar1 = uVar10 * 3;
      uVar3 = uVar11 * 3;
      uVar4 = uVar12 * 3;
      uVar2 = uVar13 * 3;
      iVar6 = iVar5 + -4;
      iVar8 = iVar5 + (Num + 3U & 0xfffffffc);
      iVar5 = iVar6;
    } while (iVar8 != 8);
    uVar7 = -iVar6;
    uVar14 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar7 ^ 0x80000000));
    uVar15 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar7 | 1) ^ 0x80000000));
    uVar16 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar7 | 2) ^ 0x80000000));
    uVar9 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar7 | 3) ^ 0x80000000));
    return (~uVar16 & uVar4 | uVar12 & uVar16) * (~uVar14 & uVar1 | uVar10 & uVar14) *
           (~uVar15 & uVar3 | uVar11 & uVar15) * (~uVar9 & uVar2 | uVar13 & uVar9);
  }
  return 1;
}

Assistant:

int Extra_Power3( int Num )
{
    int i;
    int Res;
    Res = 1;
    for ( i = 0; i < Num; i++ )
        Res *= 3;
    return Res;
}